

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_mirjit.c
# Opt level: O0

MIR_module_t_conflict
mir_compile_C_module(c2mir_options *options,MIR_context_t ctx,char *inputbuffer,char *source_name)

{
  bool bVar1;
  int iVar2;
  DLIST_MIR_module_t *list;
  MIR_module_t_conflict local_78;
  MIR_module_t_conflict local_70;
  MIR_module_t_conflict module;
  ReadBuffer read_buffer;
  char module_name [30];
  int ret_code;
  char *source_name_local;
  char *inputbuffer_local;
  MIR_context_t ctx_local;
  c2mir_options *options_local;
  
  module = (MIR_module_t_conflict)0x0;
  local_70 = (MIR_module_t_conflict)0x0;
  options->module_num = options->module_num + 1;
  read_buffer.Current_char = (size_t)inputbuffer;
  snprintf((char *)&read_buffer.Source_code,0x1e,"__mod_%lld__",options->module_num);
  options->message_file = _stderr;
  iVar2 = c2mir_compile(ctx,options,t_getc,&module,&read_buffer.Source_code,0);
  if (iVar2 != 0) {
    list = (DLIST_MIR_module_t *)MIR_get_module_list(ctx);
    local_70 = DLIST_MIR_module_t_tail(list);
  }
  bVar1 = iVar2 == 0;
  if ((!bVar1) && (local_70 == (MIR_module_t_conflict)0x0)) {
    bVar1 = true;
  }
  if ((!bVar1) && (local_70 != (MIR_module_t_conflict)0x0)) {
    MIR_load_module(ctx,local_70);
    MIR_link(ctx,MIR_set_gen_interface,import_resolver);
  }
  if ((bVar1) || (local_70 == (MIR_module_t_conflict)0x0)) {
    local_78 = (MIR_module_t_conflict)0x0;
  }
  else {
    local_78 = local_70;
  }
  return local_78;
}

Assistant:

MIR_module_t mir_compile_C_module(struct c2mir_options *options, MIR_context_t ctx,
                                  const char *inputbuffer, /* Code to be compiled */
                                  const char *source_name  /* Name of the function, must be unique */
) {
  int ret_code = 0;
  char module_name[30];
  struct ReadBuffer read_buffer = {.Current_char = 0, .Source_code = inputbuffer};
  MIR_module_t module = NULL;
  options->module_num++;
  snprintf(module_name, sizeof module_name, "__mod_%lld__", options->module_num);
  options->message_file = stderr;
  if (!c2mir_compile(ctx, options, t_getc, &read_buffer, module_name, NULL)) {
    ret_code = 1;
  }
  else {
    /* The module just compiled will be at the end of the list */
    module = DLIST_TAIL(MIR_module_t, *MIR_get_module_list(ctx));
  }
  if (ret_code == 0 && !module) {
    ret_code = 1;
  }
  if (ret_code == 0 && module) {
    MIR_load_module(ctx, module);
    MIR_link(ctx, MIR_set_gen_interface, import_resolver);
  }
  return ret_code == 0 && module ? module : NULL;
}